

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

MatchResult __thiscall r_exec::_Fact::is_timeless_evidence(_Fact *this,_Fact *target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar4;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  MatchResult local_24;
  MatchResult r;
  _Fact *target_local;
  _Fact *this_local;
  
  iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(this,0);
  iVar3 = (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(target,0);
  bVar1 = MatchObject((Code *)CONCAT44(extraout_var,iVar2),(Code *)CONCAT44(extraout_var_00,iVar3));
  if (bVar1) {
    iVar2 = (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[5])(target,0);
    iVar3 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[5])(this,0);
    uVar4 = r_code::Atom::operator==
                      ((Atom *)CONCAT44(extraout_var_01,iVar2),
                       (Atom *)CONCAT44(extraout_var_02,iVar3));
    local_24 = (MatchResult)((uVar4 & 1) == 0);
    this_local._4_4_ = local_24;
  }
  else {
    iVar2 = (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[5])(target,0);
    iVar3 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[5])(this,0);
    uVar4 = r_code::Atom::operator==
                      ((Atom *)CONCAT44(extraout_var_03,iVar2),
                       (Atom *)CONCAT44(extraout_var_04,iVar3));
    if ((uVar4 & 1) != 0) {
      iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                super_Code.super__Object._vptr__Object[9])(this,0);
      iVar3 = (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(target,0);
      bVar1 = CounterEvidence((Code *)CONCAT44(extraout_var_05,iVar2),
                              (Code *)CONCAT44(extraout_var_06,iVar3));
      if (bVar1) {
        return MATCH_SUCCESS_NEGATIVE;
      }
    }
    this_local._4_4_ = MATCH_FAILURE;
  }
  return this_local._4_4_;
}

Assistant:

MatchResult _Fact::is_timeless_evidence(const _Fact *target) const
{
    if (MatchObject(get_reference(0), target->get_reference(0))) {
        MatchResult r;

        if (target->code(0) == code(0)) {
            r = MATCH_SUCCESS_POSITIVE;
        } else {
            r = MATCH_SUCCESS_NEGATIVE;
        }

        return r;
    } else if (target->code(0) == code(0)) { // check for a counter-evidence only if both the lhs and rhs are of the same kind of fact.
        if (CounterEvidence(get_reference(0), target->get_reference(0))) {
            return MATCH_SUCCESS_NEGATIVE;
        }
    }

    return MATCH_FAILURE;
}